

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  RayHitK<4> *pRVar4;
  RayHitK<4> *pRVar5;
  RayHitK<4> *pRVar6;
  AccelData *pAVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  uint uVar40;
  undefined4 uVar41;
  ulong uVar42;
  int iVar43;
  ulong uVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  ulong *puVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  vint4 ai_2;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 in_ZMM0 [64];
  uint uVar68;
  uint uVar69;
  uint uVar86;
  vint4 ai;
  undefined1 auVar70 [16];
  uint uVar87;
  uint uVar88;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  vint4 ai_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar96;
  uint uVar105;
  uint uVar106;
  vint4 bi_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  uint uVar107;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar108 [16];
  vint4 ai_3;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  uint uVar117;
  uint uVar126;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  uint uVar127;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar128;
  float fVar134;
  float fVar135;
  vint4 bi;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar136;
  float fVar137;
  float fVar139;
  float fVar140;
  undefined1 auVar138 [16];
  float fVar141;
  float fVar142;
  float fVar146;
  float fVar147;
  float fVar148;
  vint4 bi_1;
  undefined1 auVar143 [16];
  float fVar149;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  vint4 bi_3;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  vfloat<8> fmin;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined4 uStack_28c8;
  undefined4 local_28c0;
  undefined4 uStack_28bc;
  undefined4 uStack_28b8;
  undefined4 uStack_28b4;
  undefined4 uStack_28b0;
  undefined4 uStack_28ac;
  undefined4 uStack_28a8;
  undefined4 uStack_28a4;
  undefined1 local_2870 [16];
  undefined8 local_2850;
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  undefined1 local_2790 [8];
  float fStack_2788;
  float fStack_2784;
  undefined1 local_2780 [8];
  float fStack_2778;
  float fStack_2774;
  undefined1 local_2770 [8];
  float fStack_2768;
  float fStack_2764;
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  undefined1 local_2750 [8];
  float fStack_2748;
  float fStack_2744;
  undefined1 local_2740 [16];
  float local_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  undefined1 local_2650 [16];
  undefined1 local_2640 [32];
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  undefined4 local_25c0;
  undefined4 uStack_25bc;
  undefined4 uStack_25b8;
  undefined4 uStack_25b4;
  undefined1 local_25b0 [16];
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float local_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined4 local_2520;
  undefined4 uStack_251c;
  undefined4 uStack_2518;
  undefined4 uStack_2514;
  undefined4 uStack_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  undefined4 uStack_24f0;
  undefined4 uStack_24ec;
  undefined4 uStack_24e8;
  undefined4 uStack_24e4;
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  uint local_2420;
  uint uStack_241c;
  uint uStack_2418;
  uint uStack_2414;
  uint uStack_2410;
  uint uStack_240c;
  uint uStack_2408;
  uint uStack_2404;
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar125 [64];
  
  uVar39 = mm_lookupmask_ps._248_8_;
  uVar38 = mm_lookupmask_ps._240_8_;
  uVar37 = mm_lookupmask_ps._8_8_;
  uVar36 = mm_lookupmask_ps._0_8_;
  auVar151 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar152 = vpcmpeqd_avx(auVar151,(undefined1  [16])valid_i->field_0);
  uVar40 = vmovmskps_avx(auVar152);
  if (uVar40 != 0) {
    pAVar7 = This->ptr;
    uVar47 = (ulong)(uVar40 & 0xff);
    auVar33 = *(undefined1 (*) [16])ray;
    local_2590 = *(float *)(ray + 0x10);
    auVar34 = *(undefined1 (*) [16])(ray + 0x10);
    local_25a0 = *(float *)(ray + 0x20);
    auVar35 = *(undefined1 (*) [16])(ray + 0x20);
    auVar118._8_4_ = 0x7fffffff;
    auVar118._0_8_ = 0x7fffffff7fffffff;
    auVar118._12_4_ = 0x7fffffff;
    auVar153 = *(undefined1 (*) [16])(ray + 0x40);
    auVar8 = vandps_avx(auVar118,auVar153);
    auVar108._8_4_ = 0x219392ef;
    auVar108._0_8_ = 0x219392ef219392ef;
    auVar108._12_4_ = 0x219392ef;
    auVar8 = vcmpps_avx(auVar8,auVar108,1);
    auVar10 = vblendvps_avx(auVar153,auVar108,auVar8);
    auVar8 = *(undefined1 (*) [16])(ray + 0x50);
    auVar109 = vandps_avx(auVar118,auVar8);
    auVar109 = vcmpps_avx(auVar109,auVar108,1);
    auVar11 = vblendvps_avx(auVar8,auVar108,auVar109);
    auVar109 = *(undefined1 (*) [16])(ray + 0x60);
    auVar9 = vandps_avx(auVar118,auVar109);
    auVar9 = vcmpps_avx(auVar9,auVar108,1);
    auVar9 = vblendvps_avx(auVar109,auVar108,auVar9);
    auVar108 = vrcpps_avx(auVar10);
    auVar129._8_4_ = 0x3f800000;
    auVar129._0_8_ = 0x3f8000003f800000;
    auVar129._12_4_ = 0x3f800000;
    auVar10 = vfnmadd213ps_fma(auVar10,auVar108,auVar129);
    auVar108 = vfmadd132ps_fma(auVar10,auVar108,auVar108);
    auVar10 = vrcpps_avx(auVar11);
    auVar11 = vfnmadd213ps_fma(auVar11,auVar10,auVar129);
    auVar11 = vfmadd132ps_fma(auVar11,auVar10,auVar10);
    auVar10 = vrcpps_avx(auVar9);
    auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar129);
    auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
    auVar129 = ZEXT816(0) << 0x20;
    auVar9 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar129);
    pRVar6 = ray + 0x80;
    auVar119._8_4_ = 1;
    auVar119._0_8_ = 0x100000001;
    auVar119._12_4_ = 1;
    auVar153 = vcmpps_avx(auVar153,auVar129,1);
    auVar153 = vandps_avx(auVar119,auVar153);
    auVar120._8_4_ = 2;
    auVar120._0_8_ = 0x200000002;
    auVar120._12_4_ = 2;
    auVar8 = vcmpps_avx(auVar8,auVar129,1);
    auVar8 = vandps_avx(auVar120,auVar8);
    local_25b0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar129);
    auVar8 = vorps_avx(auVar8,auVar153);
    auVar153 = vcmpps_avx(auVar109,auVar129,1);
    auVar109._8_4_ = 4;
    auVar109._0_8_ = 0x400000004;
    auVar109._12_4_ = 4;
    auVar153 = vandps_avx(auVar153,auVar109);
    auVar151 = vpor_avx(auVar152 ^ auVar151,auVar153);
    local_2650 = vpor_avx(auVar151,auVar8);
    local_2580 = *(float *)ray;
    fStack_257c = *(float *)(ray + 4);
    fStack_2578 = *(float *)(ray + 8);
    fStack_2574 = *(float *)(ray + 0xc);
    auVar151._0_4_ = auVar108._0_4_ * -*(float *)ray;
    auVar151._4_4_ = auVar108._4_4_ * -*(float *)(ray + 4);
    auVar151._8_4_ = auVar108._8_4_ * -*(float *)(ray + 8);
    auVar151._12_4_ = auVar108._12_4_ * -*(float *)(ray + 0xc);
    fStack_258c = *(float *)(ray + 0x14);
    fStack_2588 = *(float *)(ray + 0x18);
    fStack_2584 = *(float *)(ray + 0x1c);
    auVar152._0_4_ = auVar11._0_4_ * -local_2590;
    auVar152._4_4_ = auVar11._4_4_ * -*(float *)(ray + 0x14);
    auVar152._8_4_ = auVar11._8_4_ * -*(float *)(ray + 0x18);
    auVar152._12_4_ = auVar11._12_4_ * -*(float *)(ray + 0x1c);
    fStack_259c = *(float *)(ray + 0x24);
    fStack_2598 = *(float *)(ray + 0x28);
    fStack_2594 = *(float *)(ray + 0x2c);
    auVar153._0_4_ = auVar10._0_4_ * -local_25a0;
    auVar153._4_4_ = auVar10._4_4_ * -*(float *)(ray + 0x24);
    auVar153._8_4_ = auVar10._8_4_ * -*(float *)(ray + 0x28);
    auVar153._12_4_ = auVar10._12_4_ * -*(float *)(ray + 0x2c);
    local_25d0 = mm_lookupmask_ps._0_8_;
    uStack_25c8 = mm_lookupmask_ps._8_8_;
    local_25e0 = mm_lookupmask_ps._240_8_;
    uStack_25d8 = mm_lookupmask_ps._248_8_;
    local_2520 = 0x80000000;
    uStack_251c = 0x80000000;
    uStack_2518 = 0x80000000;
    uStack_2514 = 0x80000000;
    uStack_2510 = 0x80000000;
    uStack_250c = 0x80000000;
    uStack_2508 = 0x80000000;
    uStack_2504 = 0x80000000;
    local_25c0 = 0x7f800000;
    uStack_25bc = 0x7f800000;
    uStack_25b8 = 0x7f800000;
    uStack_25b4 = 0x7f800000;
    do {
      lVar49 = 0;
      for (uVar51 = uVar47; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
        lVar49 = lVar49 + 1;
      }
      uVar41 = *(undefined4 *)(local_2650 + lVar49 * 4);
      auVar56._4_4_ = uVar41;
      auVar56._0_4_ = uVar41;
      auVar56._8_4_ = uVar41;
      auVar56._12_4_ = uVar41;
      auVar71 = vpcmpeqd_avx(auVar56,local_2650);
      uVar41 = vmovmskps_avx(auVar71);
      uVar47 = ~CONCAT44((int)((ulong)lVar49 >> 0x20),uVar41) & uVar47;
      auVar98._8_4_ = 0x7f800000;
      auVar98._0_8_ = 0x7f8000007f800000;
      auVar98._12_4_ = 0x7f800000;
      auVar8 = vblendvps_avx(auVar98,auVar33,auVar71);
      auVar109 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar109,auVar8);
      auVar109 = vshufpd_avx(auVar8,auVar8,1);
      auVar109 = vminps_avx(auVar109,auVar8);
      auVar8 = vblendvps_avx(auVar98,auVar34,auVar71);
      auVar119 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar119,auVar8);
      auVar119 = vshufpd_avx(auVar8,auVar8,1);
      auVar119 = vminps_avx(auVar119,auVar8);
      auVar8 = vblendvps_avx(auVar98,auVar35,auVar71);
      auVar109 = vinsertps_avx(auVar109,auVar119,0x1c);
      auVar119 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar119,auVar8);
      auVar119 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vminps_avx(auVar119,auVar8);
      auVar129 = vinsertps_avx(auVar109,auVar8,0x20);
      auVar154._8_4_ = 0xff800000;
      auVar154._0_8_ = 0xff800000ff800000;
      auVar154._12_4_ = 0xff800000;
      auVar8 = vblendvps_avx(auVar154,auVar33,auVar71);
      auVar109 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar109,auVar8);
      auVar109 = vshufpd_avx(auVar8,auVar8,1);
      auVar109 = vmaxps_avx(auVar109,auVar8);
      auVar8 = vblendvps_avx(auVar154,auVar34,auVar71);
      auVar119 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar119,auVar8);
      auVar119 = vshufpd_avx(auVar8,auVar8,1);
      auVar119 = vmaxps_avx(auVar119,auVar8);
      auVar8 = vblendvps_avx(auVar154,auVar35,auVar71);
      auVar109 = vinsertps_avx(auVar109,auVar119,0x1c);
      auVar119 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar119,auVar8);
      auVar119 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vmaxps_avx(auVar119,auVar8);
      auVar56 = vinsertps_avx(auVar109,auVar8,0x20);
      auVar8 = vblendvps_avx(auVar98,auVar108,auVar71);
      auVar109 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar109,auVar8);
      auVar109 = vshufpd_avx(auVar8,auVar8,1);
      auVar109 = vminps_avx(auVar109,auVar8);
      auVar8 = vblendvps_avx(auVar98,auVar11,auVar71);
      auVar119 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar119,auVar8);
      auVar119 = vshufpd_avx(auVar8,auVar8,1);
      auVar119 = vminps_avx(auVar119,auVar8);
      auVar8 = vblendvps_avx(auVar98,auVar10,auVar71);
      auVar109 = vinsertps_avx(auVar109,auVar119,0x1c);
      auVar119 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar119,auVar8);
      auVar119 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vminps_avx(auVar119,auVar8);
      auVar70 = vinsertps_avx(auVar109,auVar8,0x20);
      auVar8 = vblendvps_avx(auVar154,auVar108,auVar71);
      auVar109 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar109,auVar8);
      auVar109 = vshufpd_avx(auVar8,auVar8,1);
      auVar109 = vmaxps_avx(auVar109,auVar8);
      auVar8 = vblendvps_avx(auVar154,auVar11,auVar71);
      auVar119 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar119,auVar8);
      auVar119 = vshufpd_avx(auVar8,auVar8,1);
      auVar119 = vmaxps_avx(auVar119,auVar8);
      auVar8 = vblendvps_avx(auVar154,auVar10,auVar71);
      auVar109 = vinsertps_avx(auVar109,auVar119,0x1c);
      auVar119 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar119,auVar8);
      auVar119 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vmaxps_avx(auVar119,auVar8);
      auVar130 = vinsertps_avx(auVar109,auVar8,0x20);
      auVar8 = vblendvps_avx(auVar98,auVar9,auVar71);
      auVar109 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar121 = vminps_avx(auVar109,auVar8);
      auVar8 = vblendvps_avx(auVar154,local_25b0,auVar71);
      auVar154 = vshufpd_avx(auVar121,auVar121,1);
      auVar109 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar98 = vmaxps_avx(auVar109,auVar8);
      auVar120 = vcmpps_avx(auVar70,ZEXT816(0) << 0x40,5);
      auVar109 = vblendvps_avx(auVar130,auVar70,auVar120);
      auVar119 = vblendvps_avx(auVar129,auVar56,auVar120);
      local_2600 = auVar119._0_4_;
      fStack_25fc = auVar119._4_4_;
      fStack_25f8 = auVar119._8_4_;
      fStack_25f4 = auVar119._12_4_;
      auVar89 = vshufpd_avx(auVar98,auVar98,1);
      auVar119 = vblendvps_avx(auVar56,auVar129,auVar120);
      local_2620 = auVar119._0_4_;
      fStack_261c = auVar119._4_4_;
      fStack_2618 = auVar119._8_4_;
      fStack_2614 = auVar119._12_4_;
      fStack_25f0 = auVar109._0_4_;
      auVar56 = vmovshdup_avx(auVar109);
      uVar54 = (ulong)(auVar56._0_4_ < 0.0) << 5 | 0x40;
      auVar119 = vshufpd_avx(auVar109,auVar109,1);
      local_2870 = vmaxps_avx(auVar89,auVar98);
      uVar51 = (ulong)(auVar119._0_4_ < 0.0) << 5 | 0x80;
      auVar129 = vminps_avx(auVar154,auVar121);
      auVar119 = vblendvps_avx(auVar70,auVar130,auVar120);
      auVar70._0_4_ = fStack_25f0 * local_2600;
      auVar70._4_4_ = auVar109._4_4_ * fStack_25fc;
      auVar70._8_4_ = auVar109._8_4_ * fStack_25f8;
      auVar70._12_4_ = auVar109._12_4_ * fStack_25f4;
      local_2440 = auVar119._0_4_;
      auVar130._0_4_ = local_2440 * local_2620;
      auVar130._4_4_ = auVar119._4_4_ * fStack_261c;
      auVar130._8_4_ = auVar119._8_4_ * fStack_2618;
      auVar130._12_4_ = auVar119._12_4_ * fStack_2614;
      uVar55 = (ulong)(fStack_25f0 < 0.0) * 0x20;
      local_23a0 = *(ulong *)&pAVar7[1].bounds.bounds0.lower.field_0;
      local_2398[0] = 0;
      local_2600 = fStack_25f0;
      fStack_25fc = fStack_25f0;
      fStack_25f8 = fStack_25f0;
      fStack_25f4 = fStack_25f0;
      fStack_25ec = fStack_25f0;
      fStack_25e8 = fStack_25f0;
      fStack_25e4 = fStack_25f0;
      local_2620 = -auVar70._0_4_;
      fStack_261c = -auVar70._0_4_;
      fStack_2618 = -auVar70._0_4_;
      fStack_2614 = -auVar70._0_4_;
      fStack_2610 = -auVar70._0_4_;
      fStack_260c = -auVar70._0_4_;
      fStack_2608 = -auVar70._0_4_;
      fStack_2604 = -auVar70._0_4_;
      local_2850 = auVar56._0_8_;
      local_23c0 = local_2850;
      uStack_23b8 = local_2850;
      uStack_23b0 = local_2850;
      uStack_23a8 = local_2850;
      auVar120 = vmovshdup_avx(auVar70);
      uVar117 = auVar120._0_4_;
      uVar126 = auVar120._4_4_;
      local_23e0 = uVar117 ^ 0x80000000;
      uStack_23dc = uVar126 ^ 0x80000000;
      uStack_23d8 = uVar117 ^ 0x80000000;
      uStack_23d4 = uVar126 ^ 0x80000000;
      uStack_23d0 = uVar117 ^ 0x80000000;
      uStack_23cc = uVar126 ^ 0x80000000;
      uStack_23c8 = uVar117 ^ 0x80000000;
      uStack_23c4 = uVar126 ^ 0x80000000;
      auVar109 = vshufps_avx(auVar109,auVar109,0xaa);
      local_2400._0_8_ = auVar109._0_8_;
      local_2400._8_8_ = local_2400._0_8_;
      local_2400._16_8_ = local_2400._0_8_;
      local_2400._24_8_ = local_2400._0_8_;
      auVar56 = vshufps_avx(auVar70,auVar70,0xaa);
      uVar40 = auVar56._0_4_;
      uVar86 = auVar56._4_4_;
      local_2420 = uVar40 ^ 0x80000000;
      uStack_241c = uVar86 ^ 0x80000000;
      uStack_2418 = uVar40 ^ 0x80000000;
      uStack_2414 = uVar86 ^ 0x80000000;
      uStack_2410 = uVar40 ^ 0x80000000;
      uStack_240c = uVar86 ^ 0x80000000;
      uStack_2408 = uVar40 ^ 0x80000000;
      uStack_2404 = uVar86 ^ 0x80000000;
      fStack_243c = local_2440;
      fStack_2438 = local_2440;
      fStack_2434 = local_2440;
      fStack_2430 = local_2440;
      fStack_242c = local_2440;
      fStack_2428 = local_2440;
      fStack_2424 = local_2440;
      local_2460 = -auVar130._0_4_;
      fStack_245c = -auVar130._0_4_;
      fStack_2458 = -auVar130._0_4_;
      fStack_2454 = -auVar130._0_4_;
      fStack_2450 = -auVar130._0_4_;
      fStack_244c = -auVar130._0_4_;
      fStack_2448 = -auVar130._0_4_;
      fStack_2444 = -auVar130._0_4_;
      auVar109 = vmovshdup_avx(auVar119);
      local_2480 = auVar109._0_8_;
      uStack_2478 = local_2480;
      uStack_2470 = local_2480;
      uStack_2468 = local_2480;
      auVar109 = vmovshdup_avx(auVar130);
      uVar68 = auVar109._0_4_;
      uVar87 = auVar109._4_4_;
      local_24a0 = uVar68 ^ 0x80000000;
      uStack_249c = uVar87 ^ 0x80000000;
      uStack_2498 = uVar68 ^ 0x80000000;
      uStack_2494 = uVar87 ^ 0x80000000;
      uStack_2490 = uVar68 ^ 0x80000000;
      uStack_248c = uVar87 ^ 0x80000000;
      uStack_2488 = uVar68 ^ 0x80000000;
      uStack_2484 = uVar87 ^ 0x80000000;
      auVar119 = vshufps_avx(auVar119,auVar119,0xaa);
      local_24c0 = auVar119._0_8_;
      uStack_24b8 = local_24c0;
      uStack_24b0 = local_24c0;
      uStack_24a8 = local_24c0;
      auVar119 = vshufps_avx(auVar130,auVar130,0xaa);
      uVar69 = auVar119._0_4_;
      uVar88 = auVar119._4_4_;
      local_24e0 = uVar69 ^ 0x80000000;
      uStack_24dc = uVar88 ^ 0x80000000;
      uStack_24d8 = uVar69 ^ 0x80000000;
      uStack_24d4 = uVar88 ^ 0x80000000;
      uStack_24d0 = uVar69 ^ 0x80000000;
      uStack_24cc = uVar88 ^ 0x80000000;
      uStack_24c8 = uVar69 ^ 0x80000000;
      uStack_24c4 = uVar88 ^ 0x80000000;
      auVar104 = ZEXT1664(auVar8);
      local_2500 = auVar129._0_4_;
      uStack_24fc = local_2500;
      uStack_24f8 = local_2500;
      uStack_24f4 = local_2500;
      uStack_24f0 = local_2500;
      uStack_24ec = local_2500;
      uStack_24e8 = local_2500;
      uStack_24e4 = local_2500;
      auVar8._8_4_ = 0x7f800000;
      auVar8._0_8_ = 0x7f8000007f800000;
      auVar8._12_4_ = 0x7f800000;
      auVar8 = vblendvps_avx(auVar8,auVar9,auVar71);
      puVar50 = local_2390;
      local_28c0 = local_2870._0_4_;
      uStack_28bc = local_2870._0_4_;
      uStack_28b8 = local_2870._0_4_;
      uStack_28b4 = local_2870._0_4_;
      uStack_28b0 = local_2870._0_4_;
      uStack_28ac = local_2870._0_4_;
      uStack_28a8 = local_2870._0_4_;
      uStack_28a4 = local_2870._0_4_;
      do {
        uVar41 = (undefined4)puVar50[-1];
        auVar121._4_4_ = uVar41;
        auVar121._0_4_ = uVar41;
        auVar121._8_4_ = uVar41;
        auVar121._12_4_ = uVar41;
        auVar125 = ZEXT1664(auVar121);
        puVar50 = puVar50 + -2;
        auVar129 = vcmpps_avx(auVar121,auVar104._0_16_,1);
        if ((((auVar129 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar129 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar129 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar129[0xf] < '\0') {
          uVar52 = *puVar50;
          while ((uVar52 & 8) == 0) {
            uVar42 = CONCAT44(auVar70._0_4_,auVar70._0_4_);
            auVar15._8_4_ = -auVar70._0_4_;
            auVar15._0_8_ = uVar42 ^ 0x8000000080000000;
            auVar15._12_4_ = -auVar70._0_4_;
            auVar15._16_4_ = -auVar70._0_4_;
            auVar15._20_4_ = -auVar70._0_4_;
            auVar15._24_4_ = -auVar70._0_4_;
            auVar15._28_4_ = -auVar70._0_4_;
            auVar20._4_4_ = fStack_25f0;
            auVar20._0_4_ = fStack_25f0;
            auVar20._8_4_ = fStack_25f0;
            auVar20._12_4_ = fStack_25f0;
            auVar20._16_4_ = fStack_25f0;
            auVar20._20_4_ = fStack_25f0;
            auVar20._24_4_ = fStack_25f0;
            auVar20._28_4_ = fStack_25f0;
            auVar129 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar52 + 0x40 + uVar55),auVar15,
                                       auVar20);
            auVar31._8_4_ = uVar117 ^ 0x80000000;
            auVar31._0_8_ = auVar120._0_8_ ^ 0x8000000080000000;
            auVar31._12_4_ = uVar126 ^ 0x80000000;
            auVar31._16_4_ = uStack_23d0;
            auVar31._20_4_ = uStack_23cc;
            auVar31._24_4_ = uStack_23c8;
            auVar31._28_4_ = uStack_23c4;
            auVar32._8_8_ = uStack_23b8;
            auVar32._0_8_ = local_23c0;
            auVar32._16_8_ = uStack_23b0;
            auVar32._24_8_ = uStack_23a8;
            auVar98 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar52 + 0x40 + uVar54),auVar31,auVar32
                                     );
            auVar15 = vpmaxsd_avx2(ZEXT1632(auVar129),ZEXT1632(auVar98));
            auVar30._8_4_ = uVar40 ^ 0x80000000;
            auVar30._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
            auVar30._12_4_ = uVar86 ^ 0x80000000;
            auVar30._16_4_ = uVar40 ^ 0x80000000;
            auVar30._20_4_ = uVar86 ^ 0x80000000;
            auVar30._24_4_ = uVar40 ^ 0x80000000;
            auVar30._28_4_ = uVar86 ^ 0x80000000;
            auVar129 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar52 + 0x40 + uVar51),auVar30,
                                       local_2400);
            auVar23._4_4_ = local_2500;
            auVar23._0_4_ = local_2500;
            auVar23._8_4_ = local_2500;
            auVar23._12_4_ = local_2500;
            auVar23._16_4_ = local_2500;
            auVar23._20_4_ = local_2500;
            auVar23._24_4_ = local_2500;
            auVar23._28_4_ = local_2500;
            auVar16 = vpmaxsd_avx2(ZEXT1632(auVar129),auVar23);
            local_2640 = vpmaxsd_avx2(auVar15,auVar16);
            uVar42 = CONCAT44(auVar130._0_4_,auVar130._0_4_);
            auVar28._8_4_ = -auVar130._0_4_;
            auVar28._0_8_ = uVar42 ^ 0x8000000080000000;
            auVar28._12_4_ = -auVar130._0_4_;
            auVar28._16_4_ = -auVar130._0_4_;
            auVar28._20_4_ = -auVar130._0_4_;
            auVar28._24_4_ = -auVar130._0_4_;
            auVar28._28_4_ = -auVar130._0_4_;
            auVar29._4_4_ = local_2440;
            auVar29._0_4_ = local_2440;
            auVar29._8_4_ = local_2440;
            auVar29._12_4_ = local_2440;
            auVar29._16_4_ = local_2440;
            auVar29._20_4_ = local_2440;
            auVar29._24_4_ = local_2440;
            auVar29._28_4_ = local_2440;
            auVar129 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar52 + 0x40 + (uVar55 ^ 0x20)),
                                       auVar28,auVar29);
            auVar26._8_4_ = uVar68 ^ 0x80000000;
            auVar26._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
            auVar26._12_4_ = uVar87 ^ 0x80000000;
            auVar26._16_4_ = uVar68 ^ 0x80000000;
            auVar26._20_4_ = uVar87 ^ 0x80000000;
            auVar26._24_4_ = uVar68 ^ 0x80000000;
            auVar26._28_4_ = uVar87 ^ 0x80000000;
            auVar27._8_8_ = local_2480;
            auVar27._0_8_ = local_2480;
            auVar27._16_8_ = local_2480;
            auVar27._24_8_ = local_2480;
            auVar98 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar52 + 0x40 + (uVar54 ^ 0x20)),
                                      auVar26,auVar27);
            auVar15 = vpminsd_avx2(ZEXT1632(auVar129),ZEXT1632(auVar98));
            auVar24._8_4_ = uVar69 ^ 0x80000000;
            auVar24._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
            auVar24._12_4_ = uVar88 ^ 0x80000000;
            auVar24._16_4_ = uVar69 ^ 0x80000000;
            auVar24._20_4_ = uVar88 ^ 0x80000000;
            auVar24._24_4_ = uVar69 ^ 0x80000000;
            auVar24._28_4_ = uVar88 ^ 0x80000000;
            auVar25._8_8_ = local_24c0;
            auVar25._0_8_ = local_24c0;
            auVar25._16_8_ = local_24c0;
            auVar25._24_8_ = local_24c0;
            auVar129 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar52 + 0x40 + (uVar51 ^ 0x20)),
                                       auVar24,auVar25);
            auVar16._4_4_ = uStack_28bc;
            auVar16._0_4_ = local_28c0;
            auVar16._8_4_ = uStack_28b8;
            auVar16._12_4_ = uStack_28b4;
            auVar16._16_4_ = uStack_28b0;
            auVar16._20_4_ = uStack_28ac;
            auVar16._24_4_ = uStack_28a8;
            auVar16._28_4_ = uStack_28a4;
            auVar16 = vpminsd_avx2(ZEXT1632(auVar129),auVar16);
            auVar15 = vpminsd_avx2(auVar15,auVar16);
            auVar15 = vcmpps_avx(local_2640,auVar15,2);
            iVar43 = vmovmskps_avx(auVar15);
            if (iVar43 == 0) goto LAB_005d8fd8;
            uVar48 = (ulong)(byte)iVar43;
            auVar125 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar44 = 0;
            uVar42 = 8;
            do {
              lVar49 = 0;
              for (uVar53 = uVar48; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
                lVar49 = lVar49 + 1;
              }
              uVar41 = *(undefined4 *)(uVar52 + 0x40 + lVar49 * 4);
              auVar71._4_4_ = uVar41;
              auVar71._0_4_ = uVar41;
              auVar71._8_4_ = uVar41;
              auVar71._12_4_ = uVar41;
              auVar121 = vfmadd213ps_fma(auVar71,auVar108,auVar151);
              uVar41 = *(undefined4 *)(uVar52 + 0x80 + lVar49 * 4);
              auVar89._4_4_ = uVar41;
              auVar89._0_4_ = uVar41;
              auVar89._8_4_ = uVar41;
              auVar89._12_4_ = uVar41;
              auVar71 = vfmadd213ps_fma(auVar89,auVar11,auVar152);
              uVar41 = *(undefined4 *)(uVar52 + 0xc0 + lVar49 * 4);
              auVar110._4_4_ = uVar41;
              auVar110._0_4_ = uVar41;
              auVar110._8_4_ = uVar41;
              auVar110._12_4_ = uVar41;
              auVar154 = vfmadd213ps_fma(auVar110,auVar10,auVar153);
              uVar41 = *(undefined4 *)(uVar52 + 0x60 + lVar49 * 4);
              auVar131._4_4_ = uVar41;
              auVar131._0_4_ = uVar41;
              auVar131._8_4_ = uVar41;
              auVar131._12_4_ = uVar41;
              auVar89 = vfmadd213ps_fma(auVar131,auVar108,auVar151);
              uVar41 = *(undefined4 *)(uVar52 + 0xa0 + lVar49 * 4);
              auVar97._4_4_ = uVar41;
              auVar97._0_4_ = uVar41;
              auVar97._8_4_ = uVar41;
              auVar97._12_4_ = uVar41;
              auVar110 = vfmadd213ps_fma(auVar97,auVar11,auVar152);
              uVar41 = *(undefined4 *)(uVar52 + 0xe0 + lVar49 * 4);
              auVar155._4_4_ = uVar41;
              auVar155._0_4_ = uVar41;
              auVar155._8_4_ = uVar41;
              auVar155._12_4_ = uVar41;
              auVar131 = vfmadd213ps_fma(auVar155,auVar10,auVar153);
              auVar129 = vpminsd_avx(auVar121,auVar89);
              auVar97 = auVar104._0_16_;
              auVar98 = vpminsd_avx(auVar71,auVar110);
              auVar129 = vpmaxsd_avx(auVar129,auVar98);
              auVar98 = vpminsd_avx(auVar154,auVar131);
              auVar98 = vpmaxsd_avx(auVar98,auVar8);
              auVar129 = vpmaxsd_avx(auVar129,auVar98);
              auVar104 = ZEXT1664(auVar97);
              auVar98 = vpmaxsd_avx(auVar121,auVar89);
              auVar121 = vpmaxsd_avx(auVar71,auVar110);
              auVar121 = vpminsd_avx(auVar98,auVar121);
              auVar98 = vpmaxsd_avx(auVar154,auVar131);
              auVar98 = vpminsd_avx(auVar98,auVar97);
              auVar98 = vpminsd_avx(auVar121,auVar98);
              auVar129 = vcmpps_avx(auVar129,auVar98,2);
              uVar53 = uVar42;
              if ((((auVar129 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar129 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar129 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar129[0xf] < '\0') {
                uVar41 = *(undefined4 *)(local_2640 + lVar49 * 4);
                auVar72._4_4_ = uVar41;
                auVar72._0_4_ = uVar41;
                auVar72._8_4_ = uVar41;
                auVar72._12_4_ = uVar41;
                uVar53 = *(ulong *)(uVar52 + lVar49 * 8);
                auVar98 = auVar125._0_16_;
                auVar129 = vcmpps_avx(auVar72,auVar98,1);
                if ((((auVar129 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar129 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar129 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar129[0xf]) {
                  *puVar50 = uVar53;
                  uVar53 = uVar42;
                }
                else {
                  if (uVar42 == 8) {
                    auVar125 = ZEXT1664(auVar72);
                    goto LAB_005d8524;
                  }
                  *puVar50 = uVar42;
                  auVar125 = ZEXT1664(auVar72);
                  auVar72 = auVar98;
                }
                uVar44 = uVar44 + 1;
                *(int *)(puVar50 + 1) = auVar72._0_4_;
                puVar50 = puVar50 + 2;
              }
LAB_005d8524:
              uVar48 = uVar48 - 1 & uVar48;
              uVar42 = uVar53;
            } while (uVar48 != 0);
            if (uVar53 == 8) goto LAB_005d8fd8;
            uVar52 = uVar53;
            if (1 < uVar44) {
              puVar1 = puVar50 + -4;
              puVar2 = puVar50 + -2;
              if ((uint)puVar50[-3] < (uint)puVar50[-1]) {
                uVar42 = *puVar1;
                uVar48 = puVar50[-3];
                *(int *)(puVar50 + -3) = (int)puVar50[-1];
                *puVar1 = *puVar2;
                *puVar2 = uVar42;
                uStack_28c8 = (undefined4)uVar48;
                *(undefined4 *)(puVar50 + -1) = uStack_28c8;
              }
              if (uVar44 != 2) {
                puVar3 = puVar50 + -6;
                uVar96 = (uint)puVar50[-5];
                if (uVar96 < (uint)puVar50[-1]) {
                  uVar42 = *puVar3;
                  uVar44 = puVar50[-5];
                  *(int *)(puVar50 + -5) = (int)puVar50[-1];
                  *puVar3 = *puVar2;
                  *puVar2 = uVar42;
                  uStack_28c8 = (undefined4)uVar44;
                  *(undefined4 *)(puVar50 + -1) = uStack_28c8;
                  uVar96 = (uint)puVar50[-5];
                }
                if (uVar96 < (uint)puVar50[-3]) {
                  uVar42 = *puVar3;
                  uVar44 = puVar50[-5];
                  *(int *)(puVar50 + -5) = (int)puVar50[-3];
                  *puVar3 = *puVar1;
                  *puVar1 = uVar42;
                  uStack_28c8 = (undefined4)uVar44;
                  *(undefined4 *)(puVar50 + -3) = uStack_28c8;
                }
              }
            }
          }
          auVar98 = auVar104._0_16_;
          auVar129 = vcmpps_avx(auVar98,auVar125._0_16_,6);
          if ((((auVar129 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar129 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar129 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar129[0xf] < '\0') {
            uVar42 = (ulong)((uint)uVar52 & 0xf);
            if (uVar42 != 8) {
              pRVar4 = ray + 0x50;
              auVar121 = *(undefined1 (*) [16])(ray + 0x60);
              pRVar5 = ray + 0x40;
              lVar49 = (uVar52 & 0xfffffffffffffff0) + 0xc0;
              lVar46 = 0;
              do {
                lVar45 = 0;
                do {
                  uVar96 = *(uint *)(lVar49 + lVar45 * 4);
                  if ((ulong)uVar96 == 0xffffffff) break;
                  fVar137 = *(float *)(lVar49 + -0xc0 + lVar45 * 4);
                  auVar138._4_4_ = fVar137;
                  auVar138._0_4_ = fVar137;
                  auVar138._8_4_ = fVar137;
                  auVar138._12_4_ = fVar137;
                  fVar147 = *(float *)(lVar49 + -0xb0 + lVar45 * 4);
                  auVar90._4_4_ = fVar147;
                  auVar90._0_4_ = fVar147;
                  auVar90._8_4_ = fVar147;
                  auVar90._12_4_ = fVar147;
                  fVar128 = *(float *)(lVar49 + -0xa0 + lVar45 * 4);
                  auVar143._4_4_ = fVar128;
                  auVar143._0_4_ = fVar128;
                  auVar143._8_4_ = fVar128;
                  auVar143._12_4_ = fVar128;
                  local_2750._4_4_ = *(float *)(lVar49 + -0x90 + lVar45 * 4);
                  local_2760._4_4_ = *(float *)(lVar49 + -0x80 + lVar45 * 4);
                  fVar150 = *(float *)(lVar49 + -0x70 + lVar45 * 4);
                  local_27e0._4_4_ = *(undefined4 *)(lVar49 + -0x60 + lVar45 * 4);
                  local_27e0._0_4_ = local_27e0._4_4_;
                  local_27e0._8_4_ = local_27e0._4_4_;
                  local_27e0._12_4_ = local_27e0._4_4_;
                  local_27f0._4_4_ = *(undefined4 *)(lVar49 + -0x50 + lVar45 * 4);
                  local_27f0._0_4_ = local_27f0._4_4_;
                  local_27f0._8_4_ = local_27f0._4_4_;
                  local_27f0._12_4_ = local_27f0._4_4_;
                  local_2740._4_4_ = *(undefined4 *)(lVar49 + -0x40 + lVar45 * 4);
                  local_2740._0_4_ = local_2740._4_4_;
                  local_2740._8_4_ = local_2740._4_4_;
                  local_2740._12_4_ = local_2740._4_4_;
                  local_2770._4_4_ = *(float *)(lVar49 + -0x30 + lVar45 * 4);
                  local_2780._4_4_ = *(float *)(lVar49 + -0x20 + lVar45 * 4);
                  local_2790._4_4_ = *(float *)(lVar49 + -0x10 + lVar45 * 4);
                  local_2640._0_16_ =
                       *(undefined1 (*) [16])(lVar46 * 0xe0 + (uVar52 & 0xfffffffffffffff0) + 0xd0);
                  local_2750._0_4_ = local_2750._4_4_;
                  fStack_2748 = (float)local_2750._4_4_;
                  fStack_2744 = (float)local_2750._4_4_;
                  fVar139 = fVar137 - (float)local_2750._4_4_;
                  local_2530._4_4_ = fVar139;
                  local_2530._0_4_ = fVar139;
                  local_2530._8_4_ = fVar139;
                  local_2530._12_4_ = fVar139;
                  local_2760._0_4_ = local_2760._4_4_;
                  fStack_2758 = (float)local_2760._4_4_;
                  fStack_2754 = (float)local_2760._4_4_;
                  fVar140 = fVar147 - (float)local_2760._4_4_;
                  local_2780._0_4_ = local_2780._4_4_;
                  fStack_2778 = (float)local_2780._4_4_;
                  fStack_2774 = (float)local_2780._4_4_;
                  fVar147 = (float)local_2780._4_4_ - fVar147;
                  fVar139 = fVar147 * fVar139;
                  auVar111._4_4_ = fVar147;
                  auVar111._0_4_ = fVar147;
                  auVar111._8_4_ = fVar147;
                  auVar111._12_4_ = fVar147;
                  local_2790._0_4_ = local_2790._4_4_;
                  fStack_2788 = (float)local_2790._4_4_;
                  fStack_2784 = (float)local_2790._4_4_;
                  fVar141 = (float)local_2790._4_4_ - fVar128;
                  auVar156._4_4_ = fVar141;
                  auVar156._0_4_ = fVar141;
                  auVar156._8_4_ = fVar141;
                  auVar156._12_4_ = fVar141;
                  fVar147 = fVar140 * fVar141;
                  auVar122._4_4_ = fVar147;
                  auVar122._0_4_ = fVar147;
                  auVar122._8_4_ = fVar147;
                  auVar122._12_4_ = fVar147;
                  fVar128 = fVar128 - fVar150;
                  local_2540._4_4_ = fVar128;
                  local_2540._0_4_ = fVar128;
                  local_2540._8_4_ = fVar128;
                  local_2540._12_4_ = fVar128;
                  auVar97 = vfmsub231ps_fma(auVar122,auVar111,local_2540);
                  local_2770._0_4_ = local_2770._4_4_;
                  fStack_2768 = (float)local_2770._4_4_;
                  fStack_2764 = (float)local_2770._4_4_;
                  fVar137 = (float)local_2770._4_4_ - fVar137;
                  fVar147 = fVar128 * fVar137;
                  auVar132._4_4_ = fVar147;
                  auVar132._0_4_ = fVar147;
                  auVar132._8_4_ = fVar147;
                  auVar132._12_4_ = fVar147;
                  auVar155 = vfmsub231ps_fma(auVar132,auVar156,local_2530);
                  local_2570 = vsubps_avx(auVar138,*(undefined1 (*) [16])ray);
                  auVar154 = vsubps_avx(auVar90,*(undefined1 (*) [16])(ray + 0x10));
                  auVar89 = vsubps_avx(auVar143,*(undefined1 (*) [16])(ray + 0x20));
                  fVar142 = auVar121._0_4_;
                  auVar73._0_4_ = fVar142 * local_2570._0_4_;
                  fVar146 = auVar121._4_4_;
                  auVar73._4_4_ = fVar146 * local_2570._4_4_;
                  fVar148 = auVar121._8_4_;
                  auVar73._8_4_ = fVar148 * local_2570._8_4_;
                  fVar149 = auVar121._12_4_;
                  auVar73._12_4_ = fVar149 * local_2570._12_4_;
                  local_2550 = vfmsub231ps_fma(auVar73,auVar89,*(undefined1 (*) [16])pRVar5);
                  fVar147 = (float)*(undefined8 *)pRVar5;
                  auVar57._0_4_ = auVar154._0_4_ * fVar147;
                  fVar12 = (float)((ulong)*(undefined8 *)pRVar5 >> 0x20);
                  auVar57._4_4_ = auVar154._4_4_ * fVar12;
                  fVar13 = (float)*(undefined8 *)(ray + 0x48);
                  auVar57._8_4_ = auVar154._8_4_ * fVar13;
                  fVar14 = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
                  auVar57._12_4_ = auVar154._12_4_ * fVar14;
                  local_2560 = vfmsub231ps_fma(auVar57,local_2570,*(undefined1 (*) [16])pRVar4);
                  auVar157._0_4_ = fVar141 * local_2560._0_4_;
                  auVar157._4_4_ = fVar141 * local_2560._4_4_;
                  auVar157._8_4_ = fVar141 * local_2560._8_4_;
                  auVar157._12_4_ = fVar141 * local_2560._12_4_;
                  auVar71 = vfmadd231ps_fma(auVar157,local_2550,auVar111);
                  auVar74._4_4_ = fVar140;
                  auVar74._0_4_ = fVar140;
                  auVar74._8_4_ = fVar140;
                  auVar74._12_4_ = fVar140;
                  auVar58._4_4_ = fVar137;
                  auVar58._0_4_ = fVar137;
                  auVar58._8_4_ = fVar137;
                  auVar58._12_4_ = fVar137;
                  auVar112._4_4_ = fVar139;
                  auVar112._0_4_ = fVar139;
                  auVar112._8_4_ = fVar139;
                  auVar112._12_4_ = fVar139;
                  auVar72 = vfmsub231ps_fma(auVar112,auVar58,auVar74);
                  fVar137 = (float)*(undefined8 *)pRVar4;
                  auVar91._0_4_ = fVar137 * auVar89._0_4_;
                  fVar139 = (float)((ulong)*(undefined8 *)pRVar4 >> 0x20);
                  auVar91._4_4_ = fVar139 * auVar89._4_4_;
                  fVar140 = (float)*(undefined8 *)(ray + 0x58);
                  auVar91._8_4_ = fVar140 * auVar89._8_4_;
                  fVar141 = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                  auVar91._12_4_ = fVar141 * auVar89._12_4_;
                  auVar57 = vfmsub231ps_fma(auVar91,auVar154,auVar121);
                  auVar110 = vfmadd231ps_fma(auVar71,auVar57,auVar58);
                  auVar144._0_4_ = fVar142 * auVar72._0_4_;
                  auVar144._4_4_ = fVar146 * auVar72._4_4_;
                  auVar144._8_4_ = fVar148 * auVar72._8_4_;
                  auVar144._12_4_ = fVar149 * auVar72._12_4_;
                  auVar71 = vfmadd231ps_fma(auVar144,auVar155,*(undefined1 (*) [16])pRVar4);
                  auVar131 = vfmadd231ps_fma(auVar71,auVar97,*(undefined1 (*) [16])pRVar5);
                  auVar113._8_4_ = 0x80000000;
                  auVar113._0_8_ = 0x8000000080000000;
                  auVar113._12_4_ = 0x80000000;
                  auVar71 = vandps_avx(auVar131,auVar113);
                  uVar105 = auVar71._0_4_;
                  auVar158._0_4_ = (float)(uVar105 ^ auVar110._0_4_);
                  uVar106 = auVar71._4_4_;
                  auVar158._4_4_ = (float)(uVar106 ^ auVar110._4_4_);
                  uVar107 = auVar71._8_4_;
                  auVar158._8_4_ = (float)(uVar107 ^ auVar110._8_4_);
                  uVar127 = auVar71._12_4_;
                  auVar158._12_4_ = (float)(uVar127 ^ auVar110._12_4_);
                  auVar113 = ZEXT816(0) << 0x20;
                  auVar71 = vcmpps_avx(auVar158,auVar113,5);
                  auVar110 = auVar129 & auVar71;
                  local_26d0 = (float)*(undefined8 *)(ray + 0x30);
                  fStack_26cc = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
                  fStack_26c8 = (float)*(undefined8 *)(ray + 0x38);
                  fStack_26c4 = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
                  if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar110[0xf] < '\0') {
                    auVar71 = vandps_avx(auVar71,auVar129);
                    auVar60._0_4_ = local_2560._0_4_ * fVar128;
                    auVar60._4_4_ = local_2560._4_4_ * fVar128;
                    auVar60._8_4_ = local_2560._8_4_ * fVar128;
                    auVar60._12_4_ = local_2560._12_4_ * fVar128;
                    auVar110 = vfmadd132ps_fma(auVar74,auVar60,local_2550);
                    auVar110 = vfmadd213ps_fma(local_2530,auVar57,auVar110);
                    auVar93._0_4_ = (float)(uVar105 ^ auVar110._0_4_);
                    auVar93._4_4_ = (float)(uVar106 ^ auVar110._4_4_);
                    auVar93._8_4_ = (float)(uVar107 ^ auVar110._8_4_);
                    auVar93._12_4_ = (float)(uVar127 ^ auVar110._12_4_);
                    auVar110 = vcmpps_avx(auVar93,auVar113,5);
                    auVar57 = auVar110 & auVar71;
                    if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar57[0xf] < '\0') {
                      auVar57 = vandps_avx(auVar131,auVar118);
                      auVar71 = vandps_avx(auVar71,auVar110);
                      auVar110 = vsubps_avx(auVar57,auVar158);
                      auVar110 = vcmpps_avx(auVar110,auVar93,5);
                      auVar58 = auVar110 & auVar71;
                      if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar58[0xf] < '\0') {
                        auVar71 = vandps_avx(auVar71,auVar110);
                        auVar61._0_4_ = auVar89._0_4_ * auVar72._0_4_;
                        auVar61._4_4_ = auVar89._4_4_ * auVar72._4_4_;
                        auVar61._8_4_ = auVar89._8_4_ * auVar72._8_4_;
                        auVar61._12_4_ = auVar89._12_4_ * auVar72._12_4_;
                        auVar154 = vfmadd132ps_fma(auVar154,auVar61,auVar155);
                        auVar154 = vfmadd213ps_fma(local_2570,auVar97,auVar154);
                        auVar76._0_4_ = (float)(uVar105 ^ auVar154._0_4_);
                        auVar76._4_4_ = (float)(uVar106 ^ auVar154._4_4_);
                        auVar76._8_4_ = (float)(uVar107 ^ auVar154._8_4_);
                        auVar76._12_4_ = (float)(uVar127 ^ auVar154._12_4_);
                        auVar62._0_4_ = auVar57._0_4_ * local_26d0;
                        auVar62._4_4_ = auVar57._4_4_ * fStack_26cc;
                        auVar62._8_4_ = auVar57._8_4_ * fStack_26c8;
                        auVar62._12_4_ = auVar57._12_4_ * fStack_26c4;
                        auVar99._0_4_ = auVar57._0_4_ * *(float *)pRVar6;
                        auVar99._4_4_ = auVar57._4_4_ * *(float *)(ray + 0x84);
                        auVar99._8_4_ = auVar57._8_4_ * *(float *)(ray + 0x88);
                        auVar99._12_4_ = auVar57._12_4_ * *(float *)(ray + 0x8c);
                        auVar154 = vcmpps_avx(auVar62,auVar76,1);
                        auVar89 = vcmpps_avx(auVar76,auVar99,2);
                        auVar154 = vandps_avx(auVar154,auVar89);
                        auVar89 = auVar71 & auVar154;
                        if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar89 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar89 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar89[0xf] < '\0') {
                          auVar71 = vandps_avx(auVar71,auVar154);
                          auVar154 = vcmpps_avx(auVar131,auVar113,4);
                          auVar89 = auVar154 & auVar71;
                          if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar89 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar89 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar89[0xf] < '\0') {
                            uVar105 = ((context->scene->geometries).items[uVar96].ptr)->mask;
                            auVar63._4_4_ = uVar105;
                            auVar63._0_4_ = uVar105;
                            auVar63._8_4_ = uVar105;
                            auVar63._12_4_ = uVar105;
                            auVar71 = vandps_avx(auVar71,auVar154);
                            auVar154 = vpand_avx(auVar63,*(undefined1 (*) [16])(ray + 0x90));
                            auVar154 = vpcmpeqd_avx(auVar154,auVar113);
                            auVar89 = auVar71 & ~auVar154;
                            if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar89 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar89 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || auVar89[0xf] < '\0') {
                              auVar89 = vrcpps_avx(auVar57);
                              auVar77._8_4_ = 0x3f800000;
                              auVar77._0_8_ = 0x3f8000003f800000;
                              auVar77._12_4_ = 0x3f800000;
                              auVar110 = vfnmadd213ps_fma(auVar57,auVar89,auVar77);
                              auVar89 = vfmadd132ps_fma(auVar110,auVar89,auVar89);
                              fVar128 = auVar89._0_4_;
                              auVar64._0_4_ = fVar128 * auVar93._0_4_;
                              fVar134 = auVar89._4_4_;
                              auVar64._4_4_ = fVar134 * auVar93._4_4_;
                              fVar135 = auVar89._8_4_;
                              auVar64._8_4_ = fVar135 * auVar93._8_4_;
                              fVar136 = auVar89._12_4_;
                              auVar64._12_4_ = fVar136 * auVar93._12_4_;
                              auVar89 = vminps_avx(auVar64,auVar77);
                              auVar110 = vsubps_avx(auVar77,auVar89);
                              auVar22._8_8_ = uVar37;
                              auVar22._0_8_ = uVar36;
                              auVar89 = vblendvps_avx(auVar89,auVar110,auVar22);
                              auVar154 = vandnps_avx(auVar154,auVar71);
                              auVar100._0_4_ = fVar128 * auVar158._0_4_;
                              auVar100._4_4_ = fVar134 * auVar158._4_4_;
                              auVar100._8_4_ = fVar135 * auVar158._8_4_;
                              auVar100._12_4_ = fVar136 * auVar158._12_4_;
                              auVar71 = vminps_avx(auVar100,auVar77);
                              auVar110 = vsubps_avx(auVar77,auVar71);
                              auVar110 = vblendvps_avx(auVar71,auVar110,auVar22);
                              auVar78._0_4_ = fVar128 * auVar76._0_4_;
                              auVar78._4_4_ = fVar134 * auVar76._4_4_;
                              auVar78._8_4_ = fVar135 * auVar76._8_4_;
                              auVar78._12_4_ = fVar136 * auVar76._12_4_;
                              uVar41 = *(undefined4 *)(local_2640 + lVar45 * 4);
                              auVar114._4_4_ = uVar41;
                              auVar114._0_4_ = uVar41;
                              auVar114._8_4_ = uVar41;
                              auVar114._12_4_ = uVar41;
                              auVar71 = vmaskmovps_avx(auVar154,auVar78);
                              *(undefined1 (*) [16])pRVar6 = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar97);
                              *(undefined1 (*) [16])(ray + 0xc0) = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar155);
                              *(undefined1 (*) [16])(ray + 0xd0) = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar72);
                              *(undefined1 (*) [16])(ray + 0xe0) = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar110);
                              *(undefined1 (*) [16])(ray + 0xf0) = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar89);
                              *(undefined1 (*) [16])(ray + 0x100) = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar114);
                              *(undefined1 (*) [16])(ray + 0x110) = auVar71;
                              auVar65._4_4_ = uVar96;
                              auVar65._0_4_ = uVar96;
                              auVar65._8_4_ = uVar96;
                              auVar65._12_4_ = uVar96;
                              auVar71 = vmaskmovps_avx(auVar154,auVar65);
                              *(undefined1 (*) [16])(ray + 0x120) = auVar71;
                              uVar96 = context->user->instID[0];
                              auVar66._4_4_ = uVar96;
                              auVar66._0_4_ = uVar96;
                              auVar66._8_4_ = uVar96;
                              auVar66._12_4_ = uVar96;
                              auVar71 = vmaskmovps_avx(auVar154,auVar66);
                              *(undefined1 (*) [16])(ray + 0x130) = auVar71;
                              uVar96 = context->user->instPrimID[0];
                              auVar67._4_4_ = uVar96;
                              auVar67._0_4_ = uVar96;
                              auVar67._8_4_ = uVar96;
                              auVar67._12_4_ = uVar96;
                              auVar71 = vmaskmovps_avx(auVar154,auVar67);
                              *(undefined1 (*) [16])(ray + 0x140) = auVar71;
                            }
                          }
                        }
                      }
                    }
                  }
                  auVar154 = vsubps_avx(local_27e0,_local_2770);
                  auVar89 = vsubps_avx(local_27f0,_local_2780);
                  auVar110 = vsubps_avx(local_2740,_local_2790);
                  auVar131 = vsubps_avx(_local_2750,local_27e0);
                  auVar71 = vsubps_avx(_local_2760,local_27f0);
                  auVar17._4_4_ = fVar150;
                  auVar17._0_4_ = fVar150;
                  auVar17._8_4_ = fVar150;
                  auVar17._12_4_ = fVar150;
                  auVar97 = vsubps_avx(auVar17,local_2740);
                  auVar18._4_4_ = auVar97._4_4_ * auVar89._4_4_;
                  auVar18._0_4_ = auVar97._0_4_ * auVar89._0_4_;
                  auVar18._8_4_ = auVar97._8_4_ * auVar89._8_4_;
                  auVar18._12_4_ = auVar97._12_4_ * auVar89._12_4_;
                  auVar58 = vfmsub231ps_fma(auVar18,auVar71,auVar110);
                  auVar159._0_4_ = auVar110._0_4_ * auVar131._0_4_;
                  auVar159._4_4_ = auVar110._4_4_ * auVar131._4_4_;
                  auVar159._8_4_ = auVar110._8_4_ * auVar131._8_4_;
                  auVar159._12_4_ = auVar110._12_4_ * auVar131._12_4_;
                  auVar73 = vfmsub231ps_fma(auVar159,auVar97,auVar154);
                  auVar133._0_4_ = auVar154._0_4_ * auVar71._0_4_;
                  auVar133._4_4_ = auVar154._4_4_ * auVar71._4_4_;
                  auVar133._8_4_ = auVar154._8_4_ * auVar71._8_4_;
                  auVar133._12_4_ = auVar154._12_4_ * auVar71._12_4_;
                  auVar74 = vfmsub231ps_fma(auVar133,auVar131,auVar89);
                  auVar155 = vsubps_avx(local_27e0,*(undefined1 (*) [16])ray);
                  auVar72 = vsubps_avx(local_27f0,*(undefined1 (*) [16])(ray + 0x10));
                  auVar57 = vsubps_avx(local_2740,*(undefined1 (*) [16])(ray + 0x20));
                  auVar59._0_4_ = fVar137 * auVar57._0_4_;
                  auVar59._4_4_ = fVar139 * auVar57._4_4_;
                  auVar59._8_4_ = fVar140 * auVar57._8_4_;
                  auVar59._12_4_ = fVar141 * auVar57._12_4_;
                  auVar90 = vfmsub231ps_fma(auVar59,auVar72,auVar121);
                  auVar92._0_4_ = fVar142 * auVar155._0_4_;
                  auVar92._4_4_ = fVar146 * auVar155._4_4_;
                  auVar92._8_4_ = fVar148 * auVar155._8_4_;
                  auVar92._12_4_ = fVar149 * auVar155._12_4_;
                  auVar91 = vfmsub231ps_fma(auVar92,auVar57,*(undefined1 (*) [16])pRVar5);
                  auVar123._0_4_ = auVar72._0_4_ * fVar147;
                  auVar123._4_4_ = auVar72._4_4_ * fVar12;
                  auVar123._8_4_ = auVar72._8_4_ * fVar13;
                  auVar123._12_4_ = auVar72._12_4_ * fVar14;
                  auVar111 = vfmsub231ps_fma(auVar123,auVar155,*(undefined1 (*) [16])pRVar4);
                  auVar145._0_4_ = auVar74._0_4_ * fVar142;
                  auVar145._4_4_ = auVar74._4_4_ * fVar146;
                  auVar145._8_4_ = auVar74._8_4_ * fVar148;
                  auVar145._12_4_ = auVar74._12_4_ * fVar149;
                  auVar113 = vfmadd231ps_fma(auVar145,auVar73,*(undefined1 (*) [16])pRVar4);
                  auVar113 = vfmadd231ps_fma(auVar113,*(undefined1 (*) [16])pRVar5,auVar58);
                  auVar75._0_4_ = auVar111._0_4_ * auVar97._0_4_;
                  auVar75._4_4_ = auVar111._4_4_ * auVar97._4_4_;
                  auVar75._8_4_ = auVar111._8_4_ * auVar97._8_4_;
                  auVar75._12_4_ = auVar111._12_4_ * auVar97._12_4_;
                  auVar97 = vfmadd231ps_fma(auVar75,auVar91,auVar71);
                  auVar19._8_4_ = 0x80000000;
                  auVar19._0_8_ = 0x8000000080000000;
                  auVar19._12_4_ = 0x80000000;
                  auVar71 = vandps_avx(auVar113,auVar19);
                  auVar131 = vfmadd231ps_fma(auVar97,auVar90,auVar131);
                  uVar96 = auVar71._0_4_;
                  auVar160._0_4_ = (float)(uVar96 ^ auVar131._0_4_);
                  uVar105 = auVar71._4_4_;
                  auVar160._4_4_ = (float)(uVar105 ^ auVar131._4_4_);
                  uVar106 = auVar71._8_4_;
                  auVar160._8_4_ = (float)(uVar106 ^ auVar131._8_4_);
                  uVar107 = auVar71._12_4_;
                  auVar160._12_4_ = (float)(uVar107 ^ auVar131._12_4_);
                  auVar71 = vcmpps_avx(auVar160,_DAT_01f7aa10,5);
                  auVar131 = auVar129 & auVar71;
                  if ((((auVar131 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar131 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar131 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar131[0xf] < '\0') {
                    auVar71 = vandps_avx(auVar129,auVar71);
                    auVar79._0_4_ = auVar111._0_4_ * auVar110._0_4_;
                    auVar79._4_4_ = auVar111._4_4_ * auVar110._4_4_;
                    auVar79._8_4_ = auVar111._8_4_ * auVar110._8_4_;
                    auVar79._12_4_ = auVar111._12_4_ * auVar110._12_4_;
                    auVar89 = vfmadd213ps_fma(auVar89,auVar91,auVar79);
                    auVar154 = vfmadd213ps_fma(auVar154,auVar90,auVar89);
                    auVar124._0_4_ = (float)(uVar96 ^ auVar154._0_4_);
                    auVar124._4_4_ = (float)(uVar105 ^ auVar154._4_4_);
                    auVar124._8_4_ = (float)(uVar106 ^ auVar154._8_4_);
                    auVar124._12_4_ = (float)(uVar107 ^ auVar154._12_4_);
                    auVar154 = vcmpps_avx(auVar124,_DAT_01f7aa10,5);
                    auVar89 = auVar154 & auVar71;
                    if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar89 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar89 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar89[0xf] < '\0') {
                      auVar89 = vandps_avx(auVar113,auVar118);
                      auVar71 = vandps_avx(auVar71,auVar154);
                      auVar154 = vsubps_avx(auVar89,auVar160);
                      auVar154 = vcmpps_avx(auVar154,auVar124,5);
                      auVar110 = auVar154 & auVar71;
                      if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar110[0xf] < '\0') {
                        auVar71 = vandps_avx(auVar71,auVar154);
                        auVar80._0_4_ = auVar57._0_4_ * auVar74._0_4_;
                        auVar80._4_4_ = auVar57._4_4_ * auVar74._4_4_;
                        auVar80._8_4_ = auVar57._8_4_ * auVar74._8_4_;
                        auVar80._12_4_ = auVar57._12_4_ * auVar74._12_4_;
                        auVar154 = vfmadd132ps_fma(auVar72,auVar80,auVar73);
                        auVar154 = vfmadd132ps_fma(auVar155,auVar154,auVar58);
                        auVar81._0_4_ = (float)(uVar96 ^ auVar154._0_4_);
                        auVar81._4_4_ = (float)(uVar105 ^ auVar154._4_4_);
                        auVar81._8_4_ = (float)(uVar106 ^ auVar154._8_4_);
                        auVar81._12_4_ = (float)(uVar107 ^ auVar154._12_4_);
                        auVar94._0_4_ = auVar89._0_4_ * local_26d0;
                        auVar94._4_4_ = auVar89._4_4_ * fStack_26cc;
                        auVar94._8_4_ = auVar89._8_4_ * fStack_26c8;
                        auVar94._12_4_ = auVar89._12_4_ * fStack_26c4;
                        auVar101._0_4_ = auVar89._0_4_ * *(float *)pRVar6;
                        auVar101._4_4_ = auVar89._4_4_ * *(float *)(ray + 0x84);
                        auVar101._8_4_ = auVar89._8_4_ * *(float *)(ray + 0x88);
                        auVar101._12_4_ = auVar89._12_4_ * *(float *)(ray + 0x8c);
                        auVar154 = vcmpps_avx(auVar94,auVar81,1);
                        auVar110 = vcmpps_avx(auVar81,auVar101,2);
                        auVar154 = vandps_avx(auVar154,auVar110);
                        auVar110 = auVar71 & auVar154;
                        if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar110[0xf] < '\0') {
                          auVar71 = vandps_avx(auVar154,auVar71);
                          auVar154 = vcmpps_avx(auVar113,_DAT_01f7aa10,4);
                          auVar110 = auVar154 & auVar71;
                          if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar110 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar110[0xf] < '\0') {
                            uVar105 = *(uint *)(lVar49 + lVar45 * 4);
                            uVar96 = ((context->scene->geometries).items[uVar105].ptr)->mask;
                            auVar102._4_4_ = uVar96;
                            auVar102._0_4_ = uVar96;
                            auVar102._8_4_ = uVar96;
                            auVar102._12_4_ = uVar96;
                            auVar71 = vandps_avx(auVar71,auVar154);
                            auVar154 = vpand_avx(auVar102,*(undefined1 (*) [16])(ray + 0x90));
                            auVar154 = vpcmpeqd_avx(auVar154,_DAT_01f7aa10);
                            auVar110 = auVar71 & ~auVar154;
                            if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0 ||
                                 (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || (auVar110 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar110[0xf] < '\0') {
                              auVar110 = vrcpps_avx(auVar89);
                              auVar115._8_4_ = 0x3f800000;
                              auVar115._0_8_ = 0x3f8000003f800000;
                              auVar115._12_4_ = 0x3f800000;
                              auVar89 = vfnmadd213ps_fma(auVar89,auVar110,auVar115);
                              auVar89 = vfmadd132ps_fma(auVar89,auVar110,auVar110);
                              fVar137 = auVar89._0_4_;
                              auVar103._0_4_ = fVar137 * auVar124._0_4_;
                              fVar147 = auVar89._4_4_;
                              auVar103._4_4_ = fVar147 * auVar124._4_4_;
                              fVar128 = auVar89._8_4_;
                              auVar103._8_4_ = fVar128 * auVar124._8_4_;
                              fVar150 = auVar89._12_4_;
                              auVar103._12_4_ = fVar150 * auVar124._12_4_;
                              auVar89 = vminps_avx(auVar103,auVar115);
                              auVar110 = vsubps_avx(auVar115,auVar89);
                              auVar21._8_8_ = uVar39;
                              auVar21._0_8_ = uVar38;
                              auVar89 = vblendvps_avx(auVar89,auVar110,auVar21);
                              auVar154 = vandnps_avx(auVar154,auVar71);
                              auVar95._0_4_ = fVar137 * auVar160._0_4_;
                              auVar95._4_4_ = fVar147 * auVar160._4_4_;
                              auVar95._8_4_ = fVar128 * auVar160._8_4_;
                              auVar95._12_4_ = fVar150 * auVar160._12_4_;
                              auVar71 = vminps_avx(auVar95,auVar115);
                              auVar110 = vsubps_avx(auVar115,auVar71);
                              auVar110 = vblendvps_avx(auVar71,auVar110,auVar21);
                              auVar82._0_4_ = fVar137 * auVar81._0_4_;
                              auVar82._4_4_ = fVar147 * auVar81._4_4_;
                              auVar82._8_4_ = fVar128 * auVar81._8_4_;
                              auVar82._12_4_ = fVar150 * auVar81._12_4_;
                              uVar41 = *(undefined4 *)(local_2640 + lVar45 * 4);
                              auVar116._4_4_ = uVar41;
                              auVar116._0_4_ = uVar41;
                              auVar116._8_4_ = uVar41;
                              auVar116._12_4_ = uVar41;
                              auVar71 = vmaskmovps_avx(auVar154,auVar82);
                              *(undefined1 (*) [16])pRVar6 = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar58);
                              *(undefined1 (*) [16])(ray + 0xc0) = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar73);
                              *(undefined1 (*) [16])(ray + 0xd0) = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar74);
                              *(undefined1 (*) [16])(ray + 0xe0) = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar110);
                              *(undefined1 (*) [16])(ray + 0xf0) = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar89);
                              *(undefined1 (*) [16])(ray + 0x100) = auVar71;
                              auVar71 = vmaskmovps_avx(auVar154,auVar116);
                              *(undefined1 (*) [16])(ray + 0x110) = auVar71;
                              auVar83._4_4_ = uVar105;
                              auVar83._0_4_ = uVar105;
                              auVar83._8_4_ = uVar105;
                              auVar83._12_4_ = uVar105;
                              auVar71 = vmaskmovps_avx(auVar154,auVar83);
                              *(undefined1 (*) [16])(ray + 0x120) = auVar71;
                              uVar96 = context->user->instID[0];
                              auVar84._4_4_ = uVar96;
                              auVar84._0_4_ = uVar96;
                              auVar84._8_4_ = uVar96;
                              auVar84._12_4_ = uVar96;
                              auVar71 = vmaskmovps_avx(auVar154,auVar84);
                              *(undefined1 (*) [16])(ray + 0x130) = auVar71;
                              uVar96 = context->user->instPrimID[0];
                              auVar85._4_4_ = uVar96;
                              auVar85._0_4_ = uVar96;
                              auVar85._8_4_ = uVar96;
                              auVar85._12_4_ = uVar96;
                              auVar71 = vmaskmovps_avx(auVar154,auVar85);
                              *(undefined1 (*) [16])(ray + 0x140) = auVar71;
                            }
                          }
                        }
                      }
                    }
                  }
                  lVar45 = lVar45 + 1;
                } while (lVar45 != 4);
                lVar46 = lVar46 + 1;
                lVar49 = lVar49 + 0xe0;
              } while (lVar46 != uVar42 - 8);
            }
            auVar104 = ZEXT1664(auVar98);
            auVar121 = vcmpps_avx(*(undefined1 (*) [16])pRVar6,auVar98,1);
            auVar121 = auVar129 & auVar121;
            if ((((auVar121 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar121[0xf] < '\0') {
              auVar129 = vblendvps_avx(auVar98,*(undefined1 (*) [16])pRVar6,auVar129);
              auVar104 = ZEXT1664(auVar129);
              auVar98 = vshufps_avx(auVar129,auVar129,0xb1);
              auVar129 = vmaxps_avx(auVar98,auVar129);
              auVar98 = vshufpd_avx(auVar129,auVar129,1);
              local_2870 = vmaxss_avx(auVar98,auVar129);
            }
          }
        }
        local_28c0 = local_2870._0_4_;
        uStack_28bc = local_28c0;
        uStack_28b8 = local_28c0;
        uStack_28b4 = local_28c0;
        uStack_28b0 = local_28c0;
        uStack_28ac = local_28c0;
        uStack_28a8 = local_28c0;
        uStack_28a4 = local_28c0;
LAB_005d8fd8:
      } while (puVar50 != &local_23a0);
    } while (uVar47 != 0);
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }